

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O3

int libpd_message(char *recv,char *msg,int argc,t_atom *argv)

{
  t_pd *x;
  t_symbol *ptVar1;
  int iVar2;
  
  sys_lock();
  ptVar1 = gensym(recv);
  x = ptVar1->s_thing;
  if (x == (t_pd *)0x0) {
    iVar2 = -1;
  }
  else {
    ptVar1 = gensym(msg);
    pd_typedmess(x,ptVar1,argc,argv);
    iVar2 = 0;
  }
  sys_unlock();
  return iVar2;
}

Assistant:

int libpd_message(const char *recv, const char *msg, int argc, t_atom *argv) {
  t_pd *obj;
  sys_lock();
  obj = get_object(recv);
  if (obj == NULL)
  {
    sys_unlock();
    return -1;
  }
  pd_typedmess(obj, gensym(msg), argc, argv);
  sys_unlock();
  return 0;
}